

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

wchar_t assertion_file_mode(char *file,wchar_t line,char *pathname,wchar_t expected_mode)

{
  int iVar1;
  wchar_t wVar2;
  stat st;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  iVar1 = lstat(pathname,(stat *)&st);
  wVar2 = st.st_mode & 0x1ff;
  if (wVar2 != expected_mode || iVar1 != 0) {
    failure_start(file,line,"File %s has mode %o, expected %o",pathname,(ulong)(uint)wVar2,
                  (ulong)(uint)expected_mode);
    failure_finish(file);
  }
  return (uint)(wVar2 == expected_mode && iVar1 == 0);
}

Assistant:

int
assertion_file_mode(const char *file, int line, const char *pathname, int expected_mode)
{
	int mode;
	int r;

	assertion_count(file, line);
#if defined(_WIN32) && !defined(__CYGWIN__)
	failure_start(file, line, "assertFileMode not yet implemented for Windows");
	(void)mode; /* UNUSED */
	(void)r; /* UNUSED */
	(void)pathname; /* UNUSED */
	(void)expected_mode; /* UNUSED */
#else
	{
		struct stat st;
		r = lstat(pathname, &st);
		mode = (int)(st.st_mode & 0777);
	}
	if (r == 0 && mode == expected_mode)
			return (1);
	failure_start(file, line, "File %s has mode %o, expected %o",
	    pathname, (unsigned int)mode, (unsigned int)expected_mode);
#endif
	failure_finish(NULL);
	return (0);
}